

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

bool __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::IsAddressFromAllocator
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,void *address)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar6;
  SegmentBase<Memory::VirtualAllocWrapper> *pSVar7;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *pDVar8;
  undefined1 local_70 [8];
  Iterator decommitSegmentsIterator;
  Iterator segmentsIterator;
  Iterator fullSegmentsIterator;
  Iterator largeSegmentsIterator;
  
  pDVar8 = &(this->
            super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ).segments;
  decommitSegmentsIterator.current =
       &pDVar8->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
  segmentsIterator.list = pDVar8;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    if (pDVar8 == (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_006fad53;
      *puVar5 = 0;
      pDVar8 = segmentsIterator.list;
    }
    segmentsIterator.list =
         (pDVar8->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.
         list;
    if (segmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        decommitSegmentsIterator.current) break;
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&decommitSegmentsIterator.current);
    pcVar1 = (pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
    pDVar8 = segmentsIterator.list;
    if (((pcVar1 <= address) &&
        (address < pcVar1 + ((pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                             segmentPageCount -
                            (ulong)(pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                                   secondaryAllocPageCount) * 0x1000)) &&
       (bVar3 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsFreeOrDecommitted(pPVar6,address),
       pDVar8 = segmentsIterator.list, !bVar3)) {
      return true;
    }
  }
  segmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  segmentsIterator.current =
       &(this->
        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ).fullSegments.super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       segmentsIterator.current;
  while( true ) {
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_006fad53;
      *puVar5 = 0;
    }
    fullSegmentsIterator.list =
         ((fullSegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        segmentsIterator.current) break;
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&segmentsIterator.current);
    pcVar1 = (pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
    if (((pcVar1 <= address) &&
        (address < pcVar1 + ((pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                             segmentPageCount -
                            (ulong)(pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                                   secondaryAllocPageCount) * 0x1000)) &&
       (bVar3 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsFreeOrDecommitted(pPVar6,address),
       !bVar3)) {
      return true;
    }
  }
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  fullSegmentsIterator.current =
       (NodeBase *)
       &(this->
        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ).largeSegments;
  largeSegmentsIterator.list =
       (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       fullSegmentsIterator.current;
  while( true ) {
    if (largeSegmentsIterator.list ==
        (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_006fad53;
      *puVar5 = 0;
    }
    largeSegmentsIterator.list =
         ((largeSegmentsIterator.list)->
         super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if (largeSegmentsIterator.list ==
        (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        fullSegmentsIterator.current) break;
    pSVar7 = DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::Data
                       ((Iterator *)&fullSegmentsIterator.current);
    if ((pSVar7->address <= address) &&
       (address < pSVar7->address +
                  (pSVar7->segmentPageCount - (ulong)pSVar7->secondaryAllocPageCount) * 0x1000)) {
      return true;
    }
  }
  local_70 = (undefined1  [8])
             &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).decommitSegments;
  decommitSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)local_70;
  do {
    if (decommitSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
LAB_006fad53:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    decommitSegmentsIterator.list =
         ((decommitSegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    bVar3 = (undefined1  [8])decommitSegmentsIterator.list != local_70;
    if ((undefined1  [8])decommitSegmentsIterator.list == local_70) {
      return bVar3;
    }
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)local_70);
    pcVar1 = (pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
    if (((pcVar1 <= address) &&
        (address < pcVar1 + ((pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                             segmentPageCount -
                            (ulong)(pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                                   secondaryAllocPageCount) * 0x1000)) &&
       (bVar4 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsFreeOrDecommitted(pPVar6,address),
       !bVar4)) {
      return bVar3;
    }
  } while( true );
}

Assistant:

bool
HeapPageAllocator<T>::IsAddressFromAllocator(__in void* address)
{
    typename DListBase<PageSegmentBase<T>>::Iterator segmentsIterator(&this->segments);
    while (segmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, segmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<PageSegmentBase<T>>::Iterator fullSegmentsIterator(&this->fullSegments);
    while (fullSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, fullSegmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<SegmentBase<T>>::Iterator largeSegmentsIterator(&this->largeSegments);
    while (largeSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, largeSegmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<PageSegmentBase<T>>::Iterator decommitSegmentsIterator(&this->decommitSegments);
    while (decommitSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, decommitSegmentsIterator.Data()))
        {
            return true;
        }
    }

    return false;
}